

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_remove(roaring_bitmap_t *r,uint32_t val)

{
  ushort uVar1;
  uint16_t *puVar2;
  uint8_t *puVar3;
  bool bVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  ushort uVar7;
  int iVar8;
  undefined8 in_RAX;
  shared_container_t *sc;
  run_container_t *prVar9;
  uint uVar10;
  run_container_t *prVar11;
  uint i;
  uint uVar12;
  uint uVar13;
  uint8_t newtypecode;
  undefined8 uStack_38;
  
  iVar8 = (r->high_low_container).size;
  if ((long)iVar8 != 0) {
    puVar2 = (r->high_low_container).keys;
    uVar7 = (ushort)(val >> 0x10);
    if (puVar2[(long)iVar8 + -1] != uVar7) {
      uVar12 = iVar8 - 1;
      uVar10 = 0;
      uVar13 = uVar12;
      do {
        if ((int)uVar12 < (int)uVar10) {
          i = ~uVar10;
          break;
        }
        i = uVar10 + uVar12 >> 1;
        uVar1 = *(ushort *)((long)puVar2 + (ulong)(uVar10 + uVar12 & 0xfffffffe));
        if (uVar1 < uVar7) {
          uVar10 = i + 1;
          bVar4 = true;
          i = uVar13;
        }
        else if (uVar7 < uVar1) {
          uVar12 = i - 1;
          bVar4 = true;
          i = uVar13;
        }
        else {
          bVar4 = false;
        }
        uVar13 = i;
      } while (bVar4);
      goto LAB_001207f5;
    }
  }
  i = iVar8 - 1;
LAB_001207f5:
  if (-1 < (int)i) {
    uVar13 = i & 0xffff;
    puVar3 = (r->high_low_container).typecodes;
    sc = (shared_container_t *)(r->high_low_container).containers[uVar13];
    uStack_38 = in_RAX;
    if (puVar3[uVar13] == '\x04') {
      sc = (shared_container_t *)shared_container_extract_copy(sc,puVar3 + uVar13);
    }
    *(shared_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar13 * 8)) = sc;
    uVar6 = (r->high_low_container).typecodes[uVar13];
    prVar11 = *(run_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar13 * 8));
    uStack_38._7_1_ = uVar6;
    prVar9 = (run_container_t *)
             container_remove(prVar11,(uint16_t)val,uVar6,(uint8_t *)((long)&uStack_38 + 7));
    if (prVar9 != prVar11) {
      container_free(prVar11,uVar6);
      (r->high_low_container).containers[i] = prVar9;
      (r->high_low_container).typecodes[i] = uStack_38._7_1_;
    }
    uVar5 = uStack_38._7_1_;
    prVar11 = prVar9;
    uVar6 = uStack_38._7_1_;
    if (uStack_38._7_1_ == '\x04') {
      uVar6 = *(uint8_t *)&prVar9->runs;
      prVar11 = *(run_container_t **)prVar9;
    }
    if (uVar6 == '\x03') {
      iVar8 = run_container_cardinality(prVar11);
    }
    else {
      iVar8 = prVar11->n_runs;
    }
    if (iVar8 == 0) {
      ra_remove_at_index_and_free(&r->high_low_container,i);
    }
    else {
      (r->high_low_container).containers[i] = prVar9;
      (r->high_low_container).typecodes[i] = uVar5;
    }
  }
  return;
}

Assistant:

void roaring_bitmap_remove(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, (uint16_t)i);
        container_t *container = ra_get_container_at_index(
            &r->high_low_container, (uint16_t)i, &typecode);
        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_remove(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }
        if (container_get_cardinality(container2, newtypecode) != 0) {
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        } else {
            ra_remove_at_index_and_free(&r->high_low_container, i);
        }
    }
}